

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

void deqp::gls::BuiltinPrecisionTests::
     ContainerTraits<tcu::Matrix<float,_2,_2>,_tcu::Matrix<tcu::Interval,_2,_2>_>::doPrintIVal
               (FloatFormat *fmt,IVal *ival,ostream *os)

{
  Vector<tcu::Interval,_2> *pVVar1;
  Interval *pIVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  IVal local_68;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"(",1);
  bVar4 = false;
  lVar6 = 0;
  bVar3 = true;
  do {
    bVar5 = bVar3;
    if (bVar4) {
      std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
    }
    local_68.m_data[0].m_hi = (ival->m_data).m_data[lVar6].m_data[0].m_hi;
    pVVar1 = (ival->m_data).m_data + lVar6;
    local_68.m_data[0].m_hasNaN = pVVar1->m_data[0].m_hasNaN;
    local_68.m_data[0]._1_7_ = *(undefined7 *)&pVVar1->m_data[0].field_0x1;
    local_68.m_data[0].m_lo = pVVar1->m_data[0].m_lo;
    local_68.m_data[1].m_hi = (ival->m_data).m_data[lVar6].m_data[1].m_hi;
    pIVar2 = (ival->m_data).m_data[lVar6].m_data;
    local_68.m_data[1].m_hasNaN = pIVar2[1].m_hasNaN;
    local_68.m_data[1]._1_7_ = *(undefined7 *)&pIVar2[1].field_0x1;
    local_68.m_data[1].m_lo = pIVar2[1].m_lo;
    ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doPrintIVal
              (fmt,&local_68,os);
    lVar6 = 1;
    bVar4 = true;
    bVar3 = false;
  } while (bVar5);
  std::__ostream_insert<char,std::char_traits<char>>(os,")",1);
  return;
}

Assistant:

static void			doPrintIVal		(const FloatFormat& fmt, const IVal ival, ostream& os)
	{
		os << "(";

		for (int ndx = 0; ndx < T::SIZE; ++ndx)
		{
			if (ndx > 0)
				os << ", ";

			printIVal<Element>(fmt, ival[ndx], os);
		}

		os << ")";
	}